

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

pcut_item_t * pcut_fix_list_get_real_head(pcut_item_t *last)

{
  pcut_item_t *nested;
  pcut_item_t *ppVar1;
  int iVar2;
  pcut_extra_t *ppVar3;
  
  last->next = (pcut_item_t *)0x0;
  inline_nested_lists(last);
  ppVar1 = last->previous;
  while (nested = ppVar1, nested != (pcut_item_t *)0x0) {
    nested->next = last;
    inline_nested_lists(nested);
    last = nested;
    ppVar1 = nested->previous;
  }
  iVar2 = last->kind;
  ppVar1 = last;
  while ((iVar2 == 0 && (ppVar1 = ppVar1->next, ppVar1 != (pcut_item_t *)0x0))) {
    iVar2 = ppVar1->kind;
  }
  if (ppVar1 == (pcut_item_t *)0x0) {
LAB_00102599:
    iVar2 = last->kind;
    ppVar1 = last;
    while ((iVar2 == 0 && (ppVar1 = ppVar1->next, ppVar1 != (pcut_item_t *)0x0))) {
      iVar2 = ppVar1->kind;
    }
    if (ppVar1 != (pcut_item_t *)0x0) {
      iVar2 = 1;
      do {
        ppVar1->id = iVar2;
        iVar2 = iVar2 + 1;
        do {
          ppVar1 = ppVar1->next;
          if (ppVar1 == (pcut_item_t *)0x0) {
            return last;
          }
        } while (ppVar1->kind == 0);
      } while( true );
    }
    return last;
  }
  do {
    if (ppVar1->kind == 5) {
      for (ppVar3 = ppVar1->extras; ppVar3->type != 2; ppVar3 = ppVar3 + 1) {
        if (ppVar3->type == 1) {
          ppVar1->kind = 0;
          break;
        }
      }
    }
    do {
      ppVar1 = ppVar1->next;
      if (ppVar1 == (pcut_item_t *)0x0) goto LAB_00102599;
    } while (ppVar1->kind == 0);
  } while( true );
}

Assistant:

pcut_item_t *pcut_fix_list_get_real_head(pcut_item_t *last) {
	pcut_item_t *next, *it;

	last->next = NULL;

	inline_nested_lists(last);

	next = last;
	it = last->previous;
	while (it != NULL) {
		it->next = next;
		inline_nested_lists(it);
		next = it;
		it = it->previous;
	}

	detect_skipped_tests(next);

	set_ids(next);

	return next;
}